

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void pythonNotationDecl(void *user_data,xmlChar *name,xmlChar *publicId,xmlChar *systemId)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  
  iVar1 = PyObject_HasAttrString(user_data,"notationDecl");
  if (iVar1 != 0) {
    op = (PyObject *)
         _PyObject_CallMethod_SizeT(user_data,"notationDecl","sss",name,publicId,systemId);
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
    return;
  }
  return;
}

Assistant:

static void

pythonNotationDecl(void *user_data,
                   const xmlChar * name,
                   const xmlChar * publicId, const xmlChar * systemId)
{
    PyObject *handler;
    PyObject *result;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "notationDecl")) {
        result = PyObject_CallMethod(handler, (char *) "notationDecl",
                                     (char *) "sss", name, publicId,
                                     systemId);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}